

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<Token> __thiscall
Parser::expect(Parser *this,TokenType type,bool *error,string *errorMessage)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  _List_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  bool bVar6;
  bool bVar7;
  shared_ptr<Token> sVar8;
  undefined1 local_100 [24];
  element_type *local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  shared_ptr<Token> *token;
  shared_ptr<Token> local_90;
  undefined1 local_80 [24];
  element_type *peStack_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  int local_54;
  _List_node_base *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _List_node_base local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_54 = (int)error;
  bVar6 = false;
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)errorMessage;
  local_a8 = (element_type *)this;
  local_60._M_pi = in_R8;
  while( true ) {
    TokenBuffer::currentToken((TokenBuffer *)&local_50);
    bVar7 = true;
    if (*(int *)&local_50[2]._M_next != 1) {
      TokenBuffer::currentToken((TokenBuffer *)local_e0);
      bVar7 = *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._0_8_ + 0x20))->
                       _vptr__Sp_counted_base != local_54;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
      }
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (!bVar7) break;
    *(undefined1 *)&((_Alloc_hider *)&(local_b0._M_pi)->_vptr__Sp_counted_base)->_M_p = 1;
    if (!bVar6) {
      TokenBuffer::currentToken((TokenBuffer *)&local_50);
      iVar1 = *(int *)&local_50[2]._M_next;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (iVar1 == 1) {
        TokenBuffer::currentToken((TokenBuffer *)local_80);
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,(local_60._M_pi)->_vptr__Sp_counted_base,
                   *(long *)&(local_60._M_pi)->_M_use_count +
                   (long)(local_60._M_pi)->_vptr__Sp_counted_base);
        std::__cxx11::string::append((char *)&local_50);
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)local_80,
                    (string *)&local_50);
        this_00 = (element_type *)local_80._8_8_;
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)((long)&(local_40._M_next)->_M_next + 1));
          this_00 = (element_type *)local_80._8_8_;
        }
      }
      else {
        TokenBuffer::currentToken((TokenBuffer *)local_d0);
        token = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&token,(local_60._M_pi)->_vptr__Sp_counted_base,
                   *(long *)&(local_60._M_pi)->_M_use_count +
                   (long)(local_60._M_pi)->_vptr__Sp_counted_base);
        std::__cxx11::string::append((char *)&token);
        TokenBuffer::currentToken((TokenBuffer *)(local_d0 + 0x10));
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&token,(ulong)*(_func_int ***)local_d0._16_8_);
        peVar3 = (element_type *)(plVar2 + 2);
        if ((element_type *)*plVar2 == peVar3) {
          local_80._16_8_ = (peVar3->value)._M_dataplus._M_p;
          peStack_68 = (element_type *)plVar2[3];
          local_80._0_8_ = (element_type *)(local_80 + 0x10);
        }
        else {
          local_80._16_8_ = (peVar3->value)._M_dataplus._M_p;
          local_80._0_8_ = (element_type *)*plVar2;
        }
        local_80._8_8_ = plVar2[1];
        *plVar2 = (long)peVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append(local_80);
        p_Var4 = (_List_node_base *)(plVar2 + 2);
        if ((_List_node_base *)*plVar2 == p_Var4) {
          local_40._M_next = p_Var4->_M_next;
          local_40._M_prev = (_List_node_base *)plVar2[3];
          local_50 = &local_40;
        }
        else {
          local_40._M_next = p_Var4->_M_next;
          local_50 = (_List_node_base *)*plVar2;
        }
        local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
        *plVar2 = (long)p_Var4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)local_d0,
                    (string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)((long)&(local_40._M_next)->_M_next + 1));
        }
        if ((element_type *)local_80._0_8_ != (element_type *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,
                          (ulong)((long)(_List_node_base **)local_80._16_8_ + 1));
        }
        if (local_b8 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8);
        }
        this_00 = (element_type *)local_d0._8_8_;
        if (token != &local_90) {
          operator_delete(token,(ulong)((long)&((local_90.
                                                 super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->value)._M_dataplus._M_p + 1));
          this_00 = (element_type *)local_d0._8_8_;
        }
      }
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
    }
    TokenBuffer::currentToken((TokenBuffer *)&local_50);
    iVar1 = *(int *)&local_50[2]._M_next;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (iVar1 == 1) break;
    TokenBuffer::nextToken((TokenBuffer *)(local_100 + 0x10));
    bVar6 = true;
    if (local_e8 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
    }
  }
  peVar3 = local_a8;
  TokenBuffer::currentToken((TokenBuffer *)local_a8);
  sVar8 = TokenBuffer::nextToken((TokenBuffer *)local_100);
  _Var5 = sVar8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    _Var5._M_pi = extraout_RDX;
  }
  sVar8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  return (shared_ptr<Token>)sVar8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token>
Parser::expect(TokenType type, bool & error, const std::string & errorMessage) noexcept {
  bool foundWrongToken = false;

  while (true) {
    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile
        || this->tokenBuffer->currentToken()->tokenType != type) {
      error = true;

      // if this is our first error, report it
      if (!foundWrongToken) {
        if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
          this->reportError(this->tokenBuffer->currentToken(), errorMessage + ".");
        } else {
          this->reportError(this->tokenBuffer->currentToken(),
            errorMessage + ", but was '" + this->tokenBuffer->currentToken()->value + "'.");
        }
      }

      foundWrongToken = true;

      if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
        break;
      }

      this->tokenBuffer->nextToken();

    } else {
      break;
    }
  }

  auto token = this->tokenBuffer->currentToken();

  this->tokenBuffer->nextToken();

  return token;
}